

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O2

int eval_boolean(eval_info *info,coda_expression *expr,int *value)

{
  coda_cursor *pcVar1;
  coda_expression_type cVar2;
  int64_t iVar3;
  coda_expression_node_type cVar4;
  int iVar5;
  uint uVar6;
  pcre2_code_8 *code;
  pcre2_match_data_8 *match_data;
  char *message;
  coda_expression *pcVar7;
  PCRE2_SPTR8 pattern_00;
  int64_t *value_00;
  long len_a_00;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  double b;
  char *a_2;
  char *b_2;
  long len_b;
  long len_a;
  int errorcode;
  char *pattern;
  long pattern_length;
  double a;
  
  cVar4 = expr->tag;
  switch(cVar4) {
  case expr_greater_equal:
    pcVar7 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar7->result_type;
    if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,pcVar7,&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float(info,*(coda_expression **)(expr + 2),&b);
      if (iVar5 != 0) {
        return -1;
      }
      bVar9 = (double)CONCAT44(a._4_4_,a._0_4_) < (double)CONCAT44(b._4_4_,b._0_4_);
LAB_0010eb4e:
      cVar4 = (coda_expression_node_type)!bVar9;
      break;
    }
    if (cVar2 != coda_expression_string) {
      if (cVar2 != coda_expression_integer) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x37f,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_integer(info,pcVar7,(int64_t *)&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer(info,*(coda_expression **)(expr + 2),(int64_t *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      uVar6 = (uint)(CONCAT44(b._4_4_,b._0_4_) <= CONCAT44(a._4_4_,a._0_4_));
LAB_0010f2f1:
      *value = uVar6;
      return 0;
    }
    iVar5 = eval_string(info,pcVar7,(long *)&a,&len_a,&a_2);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_string(info,*(coda_expression **)(expr + 2),(long *)&b,&len_b,&b_2);
    lVar8 = len_b;
    pattern = a_2;
    if (iVar5 != 0) goto LAB_0010f736;
    len_a_00 = CONCAT44(len_a._4_4_,(int)len_a);
    uVar6 = compare_strings(CONCAT44(a._4_4_,a._0_4_),len_a_00,a_2,CONCAT44(b._4_4_,b._0_4_),len_b,
                            b_2);
    uVar6 = ~uVar6;
    goto LAB_0010f512;
  case expr_greater:
    pcVar7 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar7->result_type;
    if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,pcVar7,&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float(info,*(coda_expression **)(expr + 2),&b);
      if (iVar5 != 0) {
        return -1;
      }
      bVar9 = (double)CONCAT44(a._4_4_,a._0_4_) == (double)CONCAT44(b._4_4_,b._0_4_);
      bVar10 = (double)CONCAT44(a._4_4_,a._0_4_) < (double)CONCAT44(b._4_4_,b._0_4_);
LAB_0010eca4:
      cVar4 = (coda_expression_node_type)(!bVar10 && !bVar9);
      break;
    }
    if (cVar2 != coda_expression_string) {
      if (cVar2 != coda_expression_integer) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x341,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_integer(info,pcVar7,(int64_t *)&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer(info,*(coda_expression **)(expr + 2),(int64_t *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      uVar6 = (uint)(CONCAT44(b._4_4_,b._0_4_) < CONCAT44(a._4_4_,a._0_4_));
      goto LAB_0010f2f1;
    }
    iVar5 = eval_string(info,pcVar7,(long *)&a,&len_a,&a_2);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_string(info,*(coda_expression **)(expr + 2),(long *)&b,&len_b,&b_2);
    lVar8 = len_b;
    pattern = a_2;
    if (iVar5 != 0) goto LAB_0010f736;
    len_a_00 = CONCAT44(len_a._4_4_,(int)len_a);
    iVar5 = compare_strings(CONCAT44(a._4_4_,a._0_4_),len_a_00,a_2,CONCAT44(b._4_4_,b._0_4_),len_b,
                            b_2);
    uVar6 = (uint)(0 < iVar5);
    goto LAB_0010f608;
  case expr_if:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,(int *)&a);
    if (iVar5 != 0) {
      return -1;
    }
    if (a._0_4_ == 0) {
      pcVar7 = *(coda_expression **)&expr[2].is_constant;
    }
    else {
      pcVar7 = *(coda_expression **)(expr + 2);
    }
    iVar5 = eval_boolean(info,pcVar7,value);
    if (iVar5 != 0) {
      return -1;
    }
    return 0;
  case expr_index:
  case expr_index_var:
  case expr_integer:
  case expr_length:
  case expr_ltrim:
  case expr_max:
  case expr_min:
  case expr_modulo:
  case expr_multiply:
  case expr_neg:
  case expr_num_dims:
  case expr_num_elements:
  case expr_or:
  case expr_power:
  case expr_product_class:
  case expr_product_format:
  case expr_product_type:
  case expr_product_version:
switchD_0010e980_caseD_2b:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                  ,0x599,"int eval_boolean(eval_info *, const coda_expression *, int *)");
  case expr_isinf:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&a);
    if (iVar5 != 0) {
      return -1;
    }
    cVar4 = coda_isInf((double)CONCAT44(a._4_4_,a._0_4_));
    break;
  case expr_ismininf:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&a);
    if (iVar5 != 0) {
      return -1;
    }
    cVar4 = coda_isMinInf((double)CONCAT44(a._4_4_,a._0_4_));
    break;
  case expr_isnan:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&a);
    if (iVar5 != 0) {
      return -1;
    }
    cVar4 = coda_isNaN((double)CONCAT44(a._4_4_,a._0_4_));
    break;
  case expr_isplusinf:
    iVar5 = eval_float(info,*(coda_expression **)&expr[1].is_constant,&a);
    if (iVar5 != 0) {
      return -1;
    }
    cVar4 = coda_isPlusInf((double)CONCAT44(a._4_4_,a._0_4_));
    break;
  case expr_less_equal:
    pcVar7 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar7->result_type;
    if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,pcVar7,&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float(info,*(coda_expression **)(expr + 2),&b);
      if (iVar5 != 0) {
        return -1;
      }
      bVar9 = (double)CONCAT44(b._4_4_,b._0_4_) < (double)CONCAT44(a._4_4_,a._0_4_);
      goto LAB_0010eb4e;
    }
    if (cVar2 != coda_expression_string) {
      if (cVar2 != coda_expression_integer) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x3fb,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_integer(info,pcVar7,(int64_t *)&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer(info,*(coda_expression **)(expr + 2),(int64_t *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      uVar6 = (uint)(CONCAT44(a._4_4_,a._0_4_) <= CONCAT44(b._4_4_,b._0_4_));
      goto LAB_0010f2f1;
    }
    iVar5 = eval_string(info,pcVar7,(long *)&a,&len_a,&a_2);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_string(info,*(coda_expression **)(expr + 2),(long *)&b,&len_b,&b_2);
    lVar8 = len_b;
    pattern = a_2;
    if (iVar5 != 0) goto LAB_0010f736;
    len_a_00 = CONCAT44(len_a._4_4_,(int)len_a);
    iVar5 = compare_strings(CONCAT44(a._4_4_,a._0_4_),len_a_00,a_2,CONCAT44(b._4_4_,b._0_4_),len_b,
                            b_2);
    uVar6 = (uint)(iVar5 < 1);
    goto LAB_0010f608;
  case expr_less:
    pcVar7 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar7->result_type;
    if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,pcVar7,&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float(info,*(coda_expression **)(expr + 2),&b);
      if (iVar5 != 0) {
        return -1;
      }
      bVar9 = (double)CONCAT44(b._4_4_,b._0_4_) == (double)CONCAT44(a._4_4_,a._0_4_);
      bVar10 = (double)CONCAT44(b._4_4_,b._0_4_) < (double)CONCAT44(a._4_4_,a._0_4_);
      goto LAB_0010eca4;
    }
    if (cVar2 != coda_expression_string) {
      if (cVar2 != coda_expression_integer) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x3bd,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_integer(info,pcVar7,(int64_t *)&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer(info,*(coda_expression **)(expr + 2),(int64_t *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      uVar6 = (uint)(CONCAT44(a._4_4_,a._0_4_) < CONCAT44(b._4_4_,b._0_4_));
      goto LAB_0010f2f1;
    }
    iVar5 = eval_string(info,pcVar7,(long *)&a,&len_a,&a_2);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_string(info,*(coda_expression **)(expr + 2),(long *)&b,&len_b,&b_2);
    lVar8 = len_b;
    pattern = a_2;
    if (iVar5 != 0) goto LAB_0010f736;
    len_a_00 = CONCAT44(len_a._4_4_,(int)len_a);
    uVar6 = compare_strings(CONCAT44(a._4_4_,a._0_4_),len_a_00,a_2,CONCAT44(b._4_4_,b._0_4_),len_b,
                            b_2);
LAB_0010f512:
    *value = uVar6 >> 0x1f;
    goto LAB_0010f60a;
  case expr_logical_and:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar5 != 0) {
      return -1;
    }
    if (*value == 0) {
      return 0;
    }
    goto LAB_0010ed29;
  case expr_logical_or:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar5 != 0) {
      return -1;
    }
    if (*value != 0) {
      return 0;
    }
LAB_0010ed29:
    iVar5 = eval_boolean(info,*(coda_expression **)(expr + 2),value);
    if (iVar5 == 0) {
      return 0;
    }
    return -1;
  case expr_not_equal:
    pcVar7 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar7->result_type;
    if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar5 = eval_float(info,pcVar7,&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_float(info,*(coda_expression **)(expr + 2),&b);
      if (iVar5 != 0) {
        return -1;
      }
      bVar9 = (double)CONCAT44(b._4_4_,b._0_4_) != (double)CONCAT44(a._4_4_,a._0_4_);
LAB_0010eed7:
      *value = -(uint)bVar9 & 1;
      return 0;
    }
    if (cVar2 != coda_expression_string) {
      if (cVar2 != coda_expression_integer) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x303,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar5 = eval_integer(info,pcVar7,(int64_t *)&a);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_integer(info,*(coda_expression **)(expr + 2),(int64_t *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      uVar6 = (uint)(CONCAT44(a._4_4_,a._0_4_) != CONCAT44(b._4_4_,b._0_4_));
      goto LAB_0010f2f1;
    }
    iVar5 = eval_string(info,pcVar7,(long *)&a,&len_a,&a_2);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_string(info,*(coda_expression **)(expr + 2),(long *)&b,&len_b,&b_2);
    lVar8 = len_b;
    pattern = a_2;
    if (iVar5 != 0) goto LAB_0010f736;
    len_a_00 = CONCAT44(len_a._4_4_,(int)len_a);
    iVar5 = compare_strings(CONCAT44(a._4_4_,a._0_4_),len_a_00,a_2,CONCAT44(b._4_4_,b._0_4_),len_b,
                            b_2);
    uVar6 = (uint)(iVar5 != 0);
LAB_0010f608:
    *value = uVar6;
LAB_0010f60a:
    if (0 < len_a_00) {
      free(a_2);
      lVar8 = len_b;
    }
    if (lVar8 < 1) {
      return 0;
    }
    free(b_2);
    return 0;
  case expr_not:
    iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar5 != 0) {
      return -1;
    }
    cVar4 = (coda_expression_node_type)(*value == 0);
    break;
  case expr_regex:
    iVar5 = eval_string(info,*(coda_expression **)&expr[1].is_constant,(long *)&b_2,&pattern_length,
                        &pattern);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = eval_string(info,*(coda_expression **)(expr + 2),&len_a,&len_b,&a_2);
    if (iVar5 == 0) {
      if (pattern_length < 1) {
        pattern_00 = "";
        pattern_length = 0;
      }
      else {
        pattern_00 = (PCRE2_SPTR8)(pattern + (long)b_2);
      }
      code = coda_pcre2_compile_8
                       (pattern_00,pattern_length,0x30,&errorcode,(size_t *)&b,
                        (pcre2_compile_context_8 *)0x0);
      free(pattern);
      if (code != (pcre2_code_8 *)0x0) {
        if ((a_2 == (char *)0x0) && (a_2 = strdup((char *)""), a_2 == (char *)0x0)) {
          coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                         ,0x48c);
        }
        else {
          match_data = coda_pcre2_match_data_create_from_pattern_8
                                 (code,(pcre2_general_context_8 *)0x0);
          if (match_data != (pcre2_match_data_8 *)0x0) {
            uVar6 = coda_pcre2_match_8(code,(PCRE2_SPTR8)(a_2 + CONCAT44(len_a._4_4_,(int)len_a)),
                                       len_b,0,0,match_data,(pcre2_match_context_8 *)0x0);
            free(a_2);
            coda_pcre2_code_free_8(code);
            coda_pcre2_match_data_free_8(match_data);
            if ((int)uVar6 < -1) {
              coda_set_error(-0x191,"could not evaluate regex pattern (error code %d)",(ulong)uVar6)
              ;
              return -1;
            }
            if (uVar6 == 0) {
              message = "regex pattern contains too many subexpressions";
LAB_0010ee71:
              coda_set_error(-0x191,message);
              return -1;
            }
            cVar4 = (coda_expression_node_type)(0 < (int)uVar6);
            break;
          }
          coda_set_error(-1,"could not allocate regexp match data (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                         ,0x496);
          free(a_2);
        }
        coda_pcre2_code_free_8(code);
        return -1;
      }
      coda_pcre2_get_error_message_8(errorcode,(PCRE2_UCHAR8 *)&a,0x100);
      coda_set_error(-0x191,"invalid format for regex pattern (\'%s\' at position %d)",&a,
                     CONCAT44(b._4_4_,b._0_4_));
      pattern = a_2;
    }
LAB_0010f736:
    free(pattern);
    return -1;
  default:
    if (cVar4 == expr_array_all) {
      if (info->orig_cursor == (coda_cursor *)0x0) {
        __assert_fail("info->orig_cursor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x4dc,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      pcVar1 = &info->cursor;
      memcpy(&a,pcVar1,0x310);
      iVar5 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = coda_cursor_get_num_elements(pcVar1,(long *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      if (0 < CONCAT44(b._4_4_,b._0_4_)) {
        iVar5 = coda_cursor_goto_first_array_element(pcVar1);
        if (iVar5 != 0) {
          return -1;
        }
        for (lVar8 = 0; lVar8 < CONCAT44(b._4_4_,b._0_4_); lVar8 = lVar8 + 1) {
          iVar5 = eval_boolean(info,*(coda_expression **)(expr + 2),(int *)&len_a);
          if (iVar5 != 0) {
            return -1;
          }
          if ((int)len_a == 0) {
            *value = 0;
            return 0;
          }
          if ((lVar8 < CONCAT44(b._4_4_,b._0_4_) + -1) &&
             (iVar5 = coda_cursor_goto_next_array_element(pcVar1), iVar5 != 0)) {
            return -1;
          }
        }
      }
      goto LAB_0010f07c;
    }
    if (cVar4 == expr_array_exists) {
      if (info->orig_cursor == (coda_cursor *)0x0) {
        __assert_fail("info->orig_cursor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x50d,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      pcVar1 = &info->cursor;
      memcpy(&a,pcVar1,0x310);
      iVar5 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = coda_cursor_get_num_elements(pcVar1,(long *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      if (0 < CONCAT44(b._4_4_,b._0_4_)) {
        iVar5 = coda_cursor_goto_first_array_element(pcVar1);
        if (iVar5 != 0) {
          return -1;
        }
        for (lVar8 = 0; lVar8 < CONCAT44(b._4_4_,b._0_4_); lVar8 = lVar8 + 1) {
          iVar5 = eval_boolean(info,*(coda_expression **)(expr + 2),(int *)&len_a);
          if (iVar5 != 0) {
            return -1;
          }
          if ((int)len_a != 0) {
            *value = 1;
            return 0;
          }
          if ((lVar8 < CONCAT44(b._4_4_,b._0_4_) + -1) &&
             (iVar5 = coda_cursor_goto_next_array_element(pcVar1), iVar5 != 0)) {
            return -1;
          }
        }
      }
      goto LAB_0010ed91;
    }
    if (cVar4 == expr_at) {
      if (info->orig_cursor == (coda_cursor *)0x0) {
        __assert_fail("info->orig_cursor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x57a,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      memcpy(&a,&info->cursor,0x310);
      iVar5 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_boolean(info,*(coda_expression **)(expr + 2),value);
      if (iVar5 != 0) {
        return -1;
      }
      goto LAB_0010f082;
    }
    if (cVar4 == expr_with) {
      value_00 = (int64_t *)((long)((info->cursor).stack + -3) + (long)**(char **)(expr + 1) * 8);
      iVar3 = *value_00;
      iVar5 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,value_00);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_boolean(info,*(coda_expression **)(expr + 2),value);
      if (iVar5 == 0) {
        *value_00 = iVar3;
        return 0;
      }
      return -1;
    }
    if (cVar4 == expr_equal) {
      pcVar7 = *(coda_expression **)&expr[1].is_constant;
      cVar2 = pcVar7->result_type;
      if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
        iVar5 = eval_float(info,pcVar7,&a);
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = eval_float(info,*(coda_expression **)(expr + 2),&b);
        if (iVar5 != 0) {
          return -1;
        }
        bVar9 = (double)CONCAT44(b._4_4_,b._0_4_) == (double)CONCAT44(a._4_4_,a._0_4_);
        goto LAB_0010eed7;
      }
      if (cVar2 != coda_expression_string) {
        if (cVar2 != coda_expression_integer) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                        ,0x2c5,"int eval_boolean(eval_info *, const coda_expression *, int *)");
        }
        iVar5 = eval_integer(info,pcVar7,(int64_t *)&a);
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = eval_integer(info,*(coda_expression **)(expr + 2),(int64_t *)&b);
        if (iVar5 != 0) {
          return -1;
        }
        uVar6 = (uint)(CONCAT44(a._4_4_,a._0_4_) == CONCAT44(b._4_4_,b._0_4_));
        goto LAB_0010f2f1;
      }
      iVar5 = eval_string(info,pcVar7,(long *)&a,&len_a,&a_2);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = eval_string(info,*(coda_expression **)(expr + 2),(long *)&b,&len_b,&b_2);
      lVar8 = len_b;
      pattern = a_2;
      if (iVar5 != 0) goto LAB_0010f736;
      len_a_00 = CONCAT44(len_a._4_4_,(int)len_a);
      iVar5 = compare_strings(CONCAT44(a._4_4_,a._0_4_),len_a_00,a_2,CONCAT44(b._4_4_,b._0_4_),len_b
                              ,b_2);
      uVar6 = (uint)(iVar5 == 0);
      goto LAB_0010f608;
    }
    if (cVar4 != expr_exists) {
      if (cVar4 == expr_variable_exists) {
        if (info->orig_cursor == (coda_cursor *)0x0) {
          __assert_fail("info->orig_cursor != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                        ,0x53e,"int eval_boolean(eval_info *, const coda_expression *, int *)");
        }
        if (info->variable_name == (char *)0x0) {
          iVar5 = coda_product_variable_get_size
                            (info->orig_cursor->product,*(char **)(expr + 1),(long *)&a);
          if (iVar5 != 0) {
            return -1;
          }
          info->variable_name = *(char **)(expr + 1);
          lVar8 = 0;
          do {
            if (CONCAT44(a._4_4_,a._0_4_) <= lVar8) {
              *value = 0;
LAB_0010f75d:
              info->variable_name = (char *)0x0;
              return 0;
            }
            info->variable_index = lVar8;
            iVar5 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,(int *)&b);
            if (iVar5 != 0) {
              return -1;
            }
            if (b._0_4_ != 0) {
              *value = 1;
              goto LAB_0010f75d;
            }
            lVar8 = lVar8 + 1;
          } while( true );
        }
        message = "cannot perform search within search for product variables";
        goto LAB_0010ee71;
      }
      if (cVar4 != expr_constant_boolean) goto switchD_0010e980_caseD_2b;
      cVar4 = expr[1].tag;
      break;
    }
    if (info->orig_cursor == (coda_cursor *)0x0) {
      __assert_fail("info->orig_cursor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                    ,0x4b2,"int eval_boolean(eval_info *, const coda_expression *, int *)");
    }
    pcVar1 = &info->cursor;
    memcpy(&a,pcVar1,0x310);
    iVar5 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
    if (iVar5 == 0) {
      iVar5 = coda_cursor_get_type_class(pcVar1,(coda_type_class *)&b);
      if (iVar5 != 0) {
        return -1;
      }
      if (b._0_4_ == 6) {
        iVar5 = coda_cursor_get_special_type(pcVar1,(coda_special_type *)&len_a);
        if (iVar5 != 0) {
          return -1;
        }
        if ((int)len_a == 0) goto LAB_0010ed91;
      }
LAB_0010f07c:
      *value = 1;
    }
    else {
      if (*(int *)(in_FS_OFFSET + -0x11e0) == -0x191) {
        return -1;
      }
      *(undefined4 *)(in_FS_OFFSET + -0x11e0) = 0;
LAB_0010ed91:
      *value = 0;
    }
LAB_0010f082:
    memcpy(&info->cursor,&a,0x310);
    return 0;
  }
  *value = cVar4;
  return 0;
}

Assistant:

static int eval_boolean(eval_info *info, const coda_expression *expr, int *value)
{
    const coda_expression_operation *opexpr;

    if (expr->tag == expr_constant_boolean)
    {
        *value = ((coda_expression_bool_constant *)expr)->value;
        return 0;
    }

    opexpr = (const coda_expression_operation *)expr;
    switch (opexpr->tag)
    {
        case expr_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a == b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a == b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) == 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_not_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a != b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a != b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) != 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_greater:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a > b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a > b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) > 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_greater_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a >= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a >= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) >= 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_less:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a < b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a < b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) < 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_less_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a <= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a <= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) <= 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_not:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            *value = !(*value);
            break;
        case expr_logical_and:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            if (*value == 0)
            {
                return 0;
            }
            if (eval_boolean(info, opexpr->operand[1], value) != 0)
            {
                return -1;
            }
            break;
        case expr_logical_or:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            if (*value != 0)
            {
                return 0;
            }
            if (eval_boolean(info, opexpr->operand[1], value) != 0)
            {
                return -1;
            }
            break;
        case expr_isnan:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isNaN(a);
            }
            break;
        case expr_isinf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isInf(a);
            }
            break;
        case expr_isplusinf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isPlusInf(a);
            }
            break;
        case expr_ismininf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isMinInf(a);
            }
            break;
        case expr_regex:
            {
                int errorcode;
                PCRE2_SIZE erroffset;
                long matchstring_offset;
                long matchstring_length;
                char *matchstring;
                long pattern_offset;
                long pattern_length;
                char *pattern;
                pcre2_match_data *match_data;
                pcre2_code *re;
                int rc;

                if (eval_string(info, opexpr->operand[0], &pattern_offset, &pattern_length, &pattern) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &matchstring_offset, &matchstring_length, &matchstring) != 0)
                {
                    if (pattern != NULL)
                    {
                        free(pattern);
                    }
                    return -1;
                }

                if (pattern_length > 0)
                {
                    re = pcre2_compile((PCRE2_SPTR8)&pattern[pattern_offset], pattern_length,
                                       PCRE2_DOTALL | PCRE2_DOLLAR_ENDONLY, &errorcode, &erroffset, NULL);
                }
                else
                {
                    re = pcre2_compile((PCRE2_SPTR8)"", 0, PCRE2_DOTALL | PCRE2_DOLLAR_ENDONLY, &errorcode, &erroffset,
                                       NULL);
                }
                if (pattern != NULL)
                {
                    free(pattern);
                }
                if (re == NULL)
                {
                    PCRE2_UCHAR buffer[256];

                    pcre2_get_error_message(errorcode, buffer, sizeof(buffer));
                    coda_set_error(CODA_ERROR_EXPRESSION,
                                   "invalid format for regex pattern ('%s' at position %d)", buffer, erroffset);
                    if (matchstring != NULL)
                    {
                        free(matchstring);
                    }
                    return -1;
                }

                if (matchstring == NULL)
                {
                    /* pcre2_match does not except NULL for an empty matchstring */
                    matchstring = strdup("");
                    if (matchstring == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)",
                                       __FILE__, __LINE__);
                        pcre2_code_free(re);
                        return -1;
                    }
                }

                match_data = pcre2_match_data_create_from_pattern(re, NULL);
                if (match_data == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "could not allocate regexp match data (%s:%u)",
                                   __FILE__, __LINE__);
                    free(matchstring);
                    pcre2_code_free(re);
                    return -1;
                }
                rc = pcre2_match(re, (PCRE2_SPTR8)&matchstring[matchstring_offset], matchstring_length, 0, 0,
                                 match_data, NULL);
                free(matchstring);
                pcre2_code_free(re);
                pcre2_match_data_free(match_data);
                if (rc < 0 && rc != PCRE2_ERROR_NOMATCH)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "could not evaluate regex pattern (error code %d)", rc);
                    return -1;
                }
                if (rc == 0)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "regex pattern contains too many subexpressions");
                    return -1;
                }
                *value = (rc > 0);
            }
            break;
        case expr_exists:
            {
                coda_cursor prev_cursor;
                coda_type_class type_class;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    if (coda_errno != CODA_ERROR_EXPRESSION)
                    {
                        /* could not access path */
                        coda_errno = 0;
                        *value = 0;
                        info->cursor = prev_cursor;
                        return 0;
                    }
                    return -1;
                }
                if (coda_cursor_get_type_class(&info->cursor, &type_class) != 0)
                {
                    return -1;
                }
                if (type_class == coda_special_class)
                {
                    coda_special_type special_type;

                    if (coda_cursor_get_special_type(&info->cursor, &special_type) != 0)
                    {
                        return -1;
                    }
                    if (special_type == coda_special_no_data)
                    {
                        *value = 0;
                        info->cursor = prev_cursor;
                        return 0;
                    }
                }
                *value = 1;
                info->cursor = prev_cursor;
            }
            break;
        case expr_array_all:
            {
                coda_cursor prev_cursor;
                long num_elements;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (coda_cursor_get_num_elements(&info->cursor, &num_elements) != 0)
                {
                    return -1;
                }
                if (num_elements > 0)
                {
                    long i;

                    if (coda_cursor_goto_first_array_element(&info->cursor) != 0)
                    {
                        return -1;
                    }
                    for (i = 0; i < num_elements; i++)
                    {
                        int condition;

                        if (eval_boolean(info, opexpr->operand[1], &condition) != 0)
                        {
                            return -1;
                        }
                        if (!condition)
                        {
                            *value = 0;
                            return 0;
                        }
                        if (i < num_elements - 1)
                        {
                            if (coda_cursor_goto_next_array_element(&info->cursor) != 0)
                            {
                                return -1;
                            }
                        }
                    }
                }
                *value = 1;
                info->cursor = prev_cursor;
            }
            break;
        case expr_array_exists:
            {
                coda_cursor prev_cursor;
                long num_elements;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (coda_cursor_get_num_elements(&info->cursor, &num_elements) != 0)
                {
                    return -1;
                }
                if (num_elements > 0)
                {
                    long i;

                    if (coda_cursor_goto_first_array_element(&info->cursor) != 0)
                    {
                        return -1;
                    }
                    for (i = 0; i < num_elements; i++)
                    {
                        int condition;

                        if (eval_boolean(info, opexpr->operand[1], &condition) != 0)
                        {
                            return -1;
                        }
                        if (condition)
                        {
                            *value = 1;
                            return 0;
                        }
                        if (i < num_elements - 1)
                        {
                            if (coda_cursor_goto_next_array_element(&info->cursor) != 0)
                            {
                                return -1;
                            }
                        }
                    }
                }
                *value = 0;
                info->cursor = prev_cursor;
            }
            break;
        case expr_variable_exists:
            {
                long size;
                long i;

                assert(info->orig_cursor != NULL);
                if (info->variable_name != NULL)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot perform search within search for product variables");
                    return -1;
                }

                if (coda_product_variable_get_size(info->orig_cursor->product, opexpr->identifier, &size) != 0)
                {
                    return -1;
                }
                info->variable_name = opexpr->identifier;
                for (i = 0; i < size; i++)
                {
                    int condition;

                    info->variable_index = i;
                    if (eval_boolean(info, opexpr->operand[0], &condition) != 0)
                    {
                        return -1;
                    }
                    if (condition)
                    {
                        *value = 1;
                        info->variable_name = NULL;
                        return 0;
                    }
                }
                *value = 0;
                info->variable_name = NULL;
            }
            break;
        case expr_if:
            {
                int condition;

                if (eval_boolean(info, opexpr->operand[0], &condition) != 0)
                {
                    return -1;
                }
                if (condition)
                {
                    if (eval_boolean(info, opexpr->operand[1], value) != 0)
                    {
                        return -1;
                    }
                }
                else
                {
                    if (eval_boolean(info, opexpr->operand[2], value) != 0)
                    {
                        return -1;
                    }
                }
            }
            break;
        case expr_at:
            {
                coda_cursor prev_cursor;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (eval_boolean(info, opexpr->operand[1], value) != 0)
                {
                    return -1;
                }
                info->cursor = prev_cursor;
            }
            break;
        case expr_with:
            {
                int64_t prev_index;
                int index_id = opexpr->identifier[0] - 'i';

                prev_index = info->index[index_id];
                if (eval_integer(info, opexpr->operand[0], &info->index[index_id]) != 0)
                {
                    return -1;
                }
                if (eval_boolean(info, opexpr->operand[1], value) != 0)
                {
                    return -1;
                }
                info->index[index_id] = prev_index;
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    return 0;
}